

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

boolean jpeg_start_decompress(j_decompress_ptr cinfo)

{
  int iVar1;
  boolean bVar2;
  long lVar3;
  j_decompress_ptr in_RDI;
  int retcode;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (in_RDI->global_state == 0xca) {
    jinit_master_decompress(in_RDI);
    if (in_RDI->buffered_image != 0) {
      in_RDI->global_state = 0xcf;
      return 1;
    }
    in_RDI->global_state = 0xcb;
  }
  if (in_RDI->global_state == 0xcb) {
    if (in_RDI->inputctl->has_multiple_scans != 0) {
      while( true ) {
        if (in_RDI->progress != (jpeg_progress_mgr *)0x0) {
          (*in_RDI->progress->progress_monitor)((j_common_ptr)in_RDI);
        }
        iVar1 = (*in_RDI->inputctl->consume_input)(in_RDI);
        if (iVar1 == 0) {
          return 0;
        }
        if (iVar1 == 2) break;
        if ((in_RDI->progress != (jpeg_progress_mgr *)0x0) &&
           (((iVar1 == 3 || (iVar1 == 1)) &&
            (lVar3 = in_RDI->progress->pass_counter + 1, in_RDI->progress->pass_counter = lVar3,
            in_RDI->progress->pass_limit <= lVar3)))) {
          in_RDI->progress->pass_limit =
               (ulong)in_RDI->total_iMCU_rows + in_RDI->progress->pass_limit;
        }
      }
      in_stack_ffffffffffffffec = 2;
    }
    in_RDI->output_scan_number = in_RDI->input_scan_number;
  }
  else if (in_RDI->global_state != 0xcc) {
    in_RDI->err->msg_code = 0x14;
    (in_RDI->err->msg_parm).i[0] = in_RDI->global_state;
    (*in_RDI->err->error_exit)((j_common_ptr)in_RDI);
  }
  bVar2 = output_pass_setup((j_decompress_ptr)
                            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  return bVar2;
}

Assistant:

GLOBAL(boolean)
jpeg_start_decompress(j_decompress_ptr cinfo)
{
  if (cinfo->global_state == DSTATE_READY) {
    /* First call: initialize master control, select active modules */
    jinit_master_decompress(cinfo);
    if (cinfo->buffered_image) {
      /* No more work here; expecting jpeg_start_output next */
      cinfo->global_state = DSTATE_BUFIMAGE;
      return TRUE;
    }
    cinfo->global_state = DSTATE_PRELOAD;
  }
  if (cinfo->global_state == DSTATE_PRELOAD) {
    /* If file has multiple scans, absorb them all into the coef buffer */
    if (cinfo->inputctl->has_multiple_scans) {
#ifdef D_MULTISCAN_FILES_SUPPORTED
      for (;;) {
        int retcode;
        /* Call progress monitor hook if present */
        if (cinfo->progress != NULL)
          (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
        /* Absorb some more input */
        retcode = (*cinfo->inputctl->consume_input) (cinfo);
        if (retcode == JPEG_SUSPENDED)
          return FALSE;
        if (retcode == JPEG_REACHED_EOI)
          break;
        /* Advance progress counter if appropriate */
        if (cinfo->progress != NULL &&
            (retcode == JPEG_ROW_COMPLETED || retcode == JPEG_REACHED_SOS)) {
          if (++cinfo->progress->pass_counter >= cinfo->progress->pass_limit) {
            /* jdmaster underestimated number of scans; ratchet up one scan */
            cinfo->progress->pass_limit += (long)cinfo->total_iMCU_rows;
          }
        }
      }
#else
      ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif /* D_MULTISCAN_FILES_SUPPORTED */
    }
    cinfo->output_scan_number = cinfo->input_scan_number;
  } else if (cinfo->global_state != DSTATE_PRESCAN)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  /* Perform any dummy output passes, and set up for the final pass */
  return output_pass_setup(cinfo);
}